

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exec.cc
# Opt level: O1

Tensor * __thiscall
cnn::SimpleExecutionEngine::incremental_forward(SimpleExecutionEngine *this,VariableIndex *i)

{
  uint uVar1;
  ComputationGraph *pCVar2;
  Node *this_00;
  pointer pVVar3;
  pointer pTVar4;
  bool bVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined8 uVar8;
  byte bVar9;
  byte bVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  int iVar13;
  value_type *__val;
  pointer pVVar14;
  float *pfVar15;
  undefined4 extraout_var;
  void *pvVar16;
  uint uVar17;
  ulong uVar18;
  ulong uVar19;
  ushort uVar20;
  undefined1 auVar21 [32];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> xs;
  undefined1 local_48 [16];
  undefined1 (*local_38) [64];
  
  uVar17 = i->t;
  pCVar2 = (this->super_ExecutionEngine).cg;
  if ((ulong)((long)(pCVar2->nodes).super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(pCVar2->nodes).super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 3) <= (ulong)uVar17) {
    __assert_fail("i < cg.nodes.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/LeonCrashCode[P]InOrderParser/cnn/exec.cc"
                  ,0x27,
                  "virtual const Tensor &cnn::SimpleExecutionEngine::incremental_forward(VariableIndex)"
                 );
  }
  uVar1 = (this->num_nodes_evaluated).t;
  if (uVar1 == 0) {
    fxs->used = 0;
  }
  if (uVar1 <= uVar17) {
    std::vector<cnn::Tensor,_std::allocator<cnn::Tensor>_>::resize(&this->nfxs,(ulong)(uVar17 + 1));
    local_48 = (undefined1  [16])0x0;
    local_38 = (undefined1 (*) [64])0x0;
    local_48._0_8_ = operator_new(0x80);
    local_38 = (undefined1 (*) [64])(local_48._0_8_ + 0x80);
    auVar22 = vmovdqu64_avx512f(ZEXT1664((undefined1  [16])0x0));
    *(undefined1 (*) [64])local_48._0_8_ = auVar22;
    auVar22 = vmovdqu64_avx512f(ZEXT1664((undefined1  [16])0x0));
    *(undefined1 (*) [64])(local_48._0_8_ + 0x40) = auVar22;
    local_48._8_8_ = local_38;
    uVar17 = (this->num_nodes_evaluated).t;
    if (uVar17 <= i->t) {
      do {
        this_00 = (((this->super_ExecutionEngine).cg)->nodes).
                  super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar17];
        std::vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>::resize
                  ((vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *)local_48,
                   (ulong)((long)(this_00->args).
                                 super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(this_00->args).
                                super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 2 & 0xffffffff);
        pVVar14 = (this_00->args).
                  super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        pVVar3 = (this_00->args).
                 super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>._M_impl
                 .super__Vector_impl_data._M_finish;
        if (pVVar14 != pVVar3) {
          uVar17 = 0;
          do {
            *(pointer *)(local_48._0_8_ + (ulong)uVar17 * 8) =
                 (this->nfxs).super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl.
                 super__Vector_impl_data._M_start + pVVar14->t;
            uVar17 = uVar17 + 1;
            pVVar14 = pVVar14 + 1;
          } while (pVVar14 != pVVar3);
        }
        uVar17 = (this->num_nodes_evaluated).t;
        pTVar4 = (this->nfxs).super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pTVar4[uVar17].d.bd = (this_00->dim).bd;
        uVar8 = *(undefined8 *)((this_00->dim).d + 2);
        uVar11 = *(undefined8 *)((this_00->dim).d + 4);
        uVar12 = *(undefined8 *)((this_00->dim).d + 6);
        pTVar4 = pTVar4 + uVar17;
        *(undefined8 *)(pTVar4->d).d = *(undefined8 *)(this_00->dim).d;
        *(undefined8 *)((pTVar4->d).d + 2) = uVar8;
        *(undefined8 *)((pTVar4->d).d + 4) = uVar11;
        *(undefined8 *)((pTVar4->d).d + 6) = uVar12;
        uVar18 = (ulong)(this_00->dim).nd;
        auVar22 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
        auVar23 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
        if (uVar18 == 0) {
          iVar13 = 1;
        }
        else {
          auVar24 = vpbroadcastq_avx512f();
          uVar19 = 0;
          auVar25 = vpbroadcastd_avx512f(ZEXT416(1));
          do {
            auVar26 = vmovdqa64_avx512f(auVar25);
            auVar25 = vpbroadcastq_avx512f();
            auVar27 = vporq_avx512f(auVar25,auVar22);
            auVar25 = vporq_avx512f(auVar25,auVar23);
            uVar8 = vpcmpuq_avx512f(auVar25,auVar24,2);
            bVar9 = (byte)uVar8;
            uVar8 = vpcmpuq_avx512f(auVar27,auVar24,2);
            bVar10 = (byte)uVar8;
            uVar20 = CONCAT11(bVar10,bVar9);
            auVar25 = vmovdqu32_avx512f(*(undefined1 (*) [64])((this_00->dim).d + uVar19));
            auVar27._4_4_ = (uint)((byte)(uVar20 >> 1) & 1) * auVar25._4_4_;
            auVar27._0_4_ = (uint)(bVar9 & 1) * auVar25._0_4_;
            auVar27._8_4_ = (uint)((byte)(uVar20 >> 2) & 1) * auVar25._8_4_;
            auVar27._12_4_ = (uint)((byte)(uVar20 >> 3) & 1) * auVar25._12_4_;
            auVar27._16_4_ = (uint)((byte)(uVar20 >> 4) & 1) * auVar25._16_4_;
            auVar27._20_4_ = (uint)((byte)(uVar20 >> 5) & 1) * auVar25._20_4_;
            auVar27._24_4_ = (uint)((byte)(uVar20 >> 6) & 1) * auVar25._24_4_;
            auVar27._28_4_ = (uint)((byte)(uVar20 >> 7) & 1) * auVar25._28_4_;
            auVar27._32_4_ = (uint)(bVar10 & 1) * auVar25._32_4_;
            auVar27._36_4_ = (uint)(bVar10 >> 1 & 1) * auVar25._36_4_;
            auVar27._40_4_ = (uint)(bVar10 >> 2 & 1) * auVar25._40_4_;
            auVar27._44_4_ = (uint)(bVar10 >> 3 & 1) * auVar25._44_4_;
            auVar27._48_4_ = (uint)(bVar10 >> 4 & 1) * auVar25._48_4_;
            auVar27._52_4_ = (uint)(bVar10 >> 5 & 1) * auVar25._52_4_;
            auVar27._56_4_ = (uint)(bVar10 >> 6 & 1) * auVar25._56_4_;
            auVar27._60_4_ = (uint)(bVar10 >> 7) * auVar25._60_4_;
            auVar25 = vpmulld_avx512f(auVar27,auVar26);
            uVar19 = uVar19 + 0x10;
          } while ((uVar18 + 0xf & 0xfffffffffffffff0) != uVar19);
          auVar22 = vmovdqa32_avx512f(auVar25);
          auVar23._0_4_ =
               (uint)(bVar9 & 1) * auVar22._0_4_ | (uint)!(bool)(bVar9 & 1) * auVar26._0_4_;
          bVar5 = (bool)((byte)(uVar20 >> 1) & 1);
          auVar23._4_4_ = (uint)bVar5 * auVar22._4_4_ | (uint)!bVar5 * auVar26._4_4_;
          bVar5 = (bool)((byte)(uVar20 >> 2) & 1);
          auVar23._8_4_ = (uint)bVar5 * auVar22._8_4_ | (uint)!bVar5 * auVar26._8_4_;
          bVar5 = (bool)((byte)(uVar20 >> 3) & 1);
          auVar23._12_4_ = (uint)bVar5 * auVar22._12_4_ | (uint)!bVar5 * auVar26._12_4_;
          bVar5 = (bool)((byte)(uVar20 >> 4) & 1);
          auVar23._16_4_ = (uint)bVar5 * auVar22._16_4_ | (uint)!bVar5 * auVar26._16_4_;
          bVar5 = (bool)((byte)(uVar20 >> 5) & 1);
          auVar23._20_4_ = (uint)bVar5 * auVar22._20_4_ | (uint)!bVar5 * auVar26._20_4_;
          bVar5 = (bool)((byte)(uVar20 >> 6) & 1);
          auVar23._24_4_ = (uint)bVar5 * auVar22._24_4_ | (uint)!bVar5 * auVar26._24_4_;
          bVar5 = (bool)((byte)(uVar20 >> 7) & 1);
          auVar23._28_4_ = (uint)bVar5 * auVar22._28_4_ | (uint)!bVar5 * auVar26._28_4_;
          auVar23._32_4_ =
               (uint)(bVar10 & 1) * auVar22._32_4_ | (uint)!(bool)(bVar10 & 1) * auVar26._32_4_;
          bVar5 = (bool)(bVar10 >> 1 & 1);
          auVar23._36_4_ = (uint)bVar5 * auVar22._36_4_ | (uint)!bVar5 * auVar26._36_4_;
          bVar5 = (bool)(bVar10 >> 2 & 1);
          auVar23._40_4_ = (uint)bVar5 * auVar22._40_4_ | (uint)!bVar5 * auVar26._40_4_;
          bVar5 = (bool)(bVar10 >> 3 & 1);
          auVar23._44_4_ = (uint)bVar5 * auVar22._44_4_ | (uint)!bVar5 * auVar26._44_4_;
          bVar5 = (bool)(bVar10 >> 4 & 1);
          auVar23._48_4_ = (uint)bVar5 * auVar22._48_4_ | (uint)!bVar5 * auVar26._48_4_;
          bVar5 = (bool)(bVar10 >> 5 & 1);
          auVar23._52_4_ = (uint)bVar5 * auVar22._52_4_ | (uint)!bVar5 * auVar26._52_4_;
          bVar5 = (bool)(bVar10 >> 6 & 1);
          auVar23._56_4_ = (uint)bVar5 * auVar22._56_4_ | (uint)!bVar5 * auVar26._56_4_;
          auVar23._60_4_ =
               (uint)(bVar10 >> 7) * auVar22._60_4_ | (uint)!(bool)(bVar10 >> 7) * auVar26._60_4_;
          auVar21 = vextracti64x4_avx512f(auVar23,1);
          auVar22 = vpmulld_avx512f(auVar23,ZEXT3264(auVar21));
          auVar6 = vpmulld_avx(auVar22._0_16_,auVar22._16_16_);
          auVar7 = vpshufd_avx(auVar6,0xee);
          auVar6 = vpmulld_avx(auVar6,auVar7);
          auVar7 = vpshufd_avx(auVar6,0x55);
          auVar6 = vpmulld_avx(auVar6,auVar7);
          iVar13 = auVar6._0_4_;
        }
        pfVar15 = (float *)AlignedMemoryPool::allocate(fxs,(ulong)(iVar13 * (this_00->dim).bd) << 2)
        ;
        (this->nfxs).super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl.
        super__Vector_impl_data._M_start[(this->num_nodes_evaluated).t].v = pfVar15;
        if (pfVar15 == (float *)0x0) {
          std::operator<<((ostream *)&std::cerr,"out of memory\n");
LAB_001a9aa7:
          abort();
        }
        iVar13 = (*this_00->_vptr_Node[4])(this_00);
        if (CONCAT44(extraout_var,iVar13) == 0) {
          pvVar16 = (void *)0x0;
        }
        else {
          pvVar16 = AlignedMemoryPool::allocate(fxs,CONCAT44(extraout_var,iVar13));
          if (pvVar16 == (void *)0x0) {
            std::operator<<((ostream *)&std::cerr,"aux out of memory\n");
            goto LAB_001a9aa7;
          }
        }
        this_00->aux_mem = pvVar16;
        Node::forward(this_00,(vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *)
                              local_48,
                      (this->nfxs).super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>.
                      _M_impl.super__Vector_impl_data._M_start + (this->num_nodes_evaluated).t);
        uVar17 = (this->num_nodes_evaluated).t + 1;
        (this->num_nodes_evaluated).t = uVar17;
      } while (uVar17 <= i->t);
    }
    if ((pointer)local_48._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_48._0_8_);
    }
  }
  return (this->nfxs).super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl.
         super__Vector_impl_data._M_start + i->t;
}

Assistant:

const Tensor& SimpleExecutionEngine::incremental_forward(VariableIndex i) {
  assert(i < cg.nodes.size());

  // free any old memory if this is a new CG
  if (num_nodes_evaluated == 0) fxs->free();

  if (i >= num_nodes_evaluated) {
    nfxs.resize(i + 1);

    //vector<string> dummy(5, "x");
    vector<const Tensor*> xs(16);
    for (; num_nodes_evaluated <= i; ++num_nodes_evaluated) {
      const Node* node = cg.nodes[num_nodes_evaluated];
      xs.resize(node->arity());
      unsigned ai = 0;
      for (VariableIndex arg : node->args) {
        xs[ai] = &nfxs[arg];
        ++ai;
      }
      nfxs[num_nodes_evaluated].d = node->dim;
      nfxs[num_nodes_evaluated].v = static_cast<float*>(fxs->allocate(node->dim.size() * sizeof(float)));
      if (nfxs[num_nodes_evaluated].v == nullptr) {
        cerr << "out of memory\n";
        abort();
      }
      void* aux_mem = nullptr;
      size_t aux_size = node->aux_storage_size();
      if (aux_size) {
        aux_mem = fxs->allocate(aux_size);
        if (!aux_mem) {
          cerr << "aux out of memory\n";
          abort();
        }
      }
      node->aux_mem = aux_mem;
      node->forward(xs, nfxs[num_nodes_evaluated]);
    }
  }
  return nfxs[i];
}